

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O0

double CheckInsideObstacle(double x,double y,bool measureDist)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uchar *tbs;
  reference pvVar5;
  size_type sVar6;
  size_t *siglen;
  uchar *sig;
  vector<double,_std::allocator<double>_> *ctx;
  size_t in_R8;
  double dVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double local_1a8;
  double local_1a0;
  double local_158;
  pointer local_150;
  pointer local_140;
  value_type local_130;
  double local_120;
  value_type local_110;
  double local_100;
  value_type local_f0;
  double local_e0;
  double local_c8;
  undefined1 local_90 [8];
  vector<double,_std::allocator<double>_> verty;
  vector<double,_std::allocator<double>_> vertx;
  double Ymax;
  double Ymin;
  double Xmax;
  double Xmin;
  double d;
  int nvert;
  int c;
  int j;
  int i;
  double result;
  bool measureDist_local;
  double y_local;
  double x_local;
  
  _j = -1.0;
  bVar4 = false;
  Xmax = 10000.0;
  Ymin = -10000.0;
  Ymax = 10000.0;
  vertx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xc0c3880000000000;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &verty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_90);
  for (c = 0; tbs = (uchar *)std::vector<double,_std::allocator<double>_>::size(&circles_r),
      c < (int)tbs; c = c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&circles_r,(long)c);
    dVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&circles_x,(long)c);
    dVar7 = sqr(*pvVar5 - x);
    sig = (uchar *)(long)c;
    ctx = &circles_y;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&circles_y,(size_type)sig);
    dVar8 = sqr(*pvVar5 - y);
    dVar7 = sqrt(dVar7 + dVar8);
    Xmin = dVar1 - dVar7;
    if ((!measureDist) && ((Xmin != 0.0 || (NAN(Xmin))))) {
      sign((EVP_PKEY_CTX *)ctx,sig,siglen,tbs,in_R8);
      Xmin = extraout_XMM0_Qa;
    }
    if (Xmin <= _j) {
      local_c8 = _j;
    }
    else {
      local_c8 = Xmin;
    }
    _j = local_c8;
  }
  for (c = 0; sVar6 = std::vector<double,_std::allocator<double>_>::size(&walls_xa), c < (int)sVar6;
      c = c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xa,(long)c);
    if (*pvVar5 <= Xmax) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xa,(long)c);
      local_e0 = *pvVar5;
    }
    else {
      local_e0 = Xmax;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xb,(long)c);
    if (*pvVar5 <= local_e0) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xb,(long)c);
      local_f0 = *pvVar5;
    }
    else {
      local_f0 = local_e0;
    }
    Xmax = local_f0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xa,(long)c);
    if (Ymin < *pvVar5 || Ymin == *pvVar5) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xa,(long)c);
      local_100 = *pvVar5;
    }
    else {
      local_100 = Ymin;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xb,(long)c);
    if (local_100 < *pvVar5 || local_100 == *pvVar5) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xb,(long)c);
      local_110 = *pvVar5;
    }
    else {
      local_110 = local_100;
    }
    Ymin = local_110;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_ya,(long)c);
    if (*pvVar5 <= Ymax) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_ya,(long)c);
      local_120 = *pvVar5;
    }
    else {
      local_120 = Ymax;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_yb,(long)c);
    if (*pvVar5 <= local_120) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_yb,(long)c);
      local_130 = *pvVar5;
    }
    else {
      local_130 = local_120;
    }
    Ymax = local_130;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_ya,(long)c);
    if ((double)vertx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < *pvVar5 ||
        (double)vertx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == *pvVar5) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_ya,(long)c);
      local_140 = (pointer)*pvVar5;
    }
    else {
      local_140 = vertx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_yb,(long)c);
    if ((double)local_140 < *pvVar5 || (double)local_140 == *pvVar5) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_yb,(long)c);
      local_150 = (pointer)*pvVar5;
    }
    else {
      local_150 = local_140;
    }
    vertx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_150;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xa,(long)c);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &verty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pvVar5);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_xb,(long)c);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &verty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pvVar5);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_ya,(long)c);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_90,pvVar5);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&walls_yb,(long)c);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_90,pvVar5);
  }
  if ((((x < Xmax) || (Ymin < x)) || (y < Ymax)) ||
     ((double)vertx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < y)) {
    if (-1.0 <= _j) {
      local_158 = _j;
    }
    else {
      local_158 = -1.0;
    }
    _j = local_158;
  }
  else {
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)
                       &verty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    nvert = (int)sVar6 + -1;
    for (c = 0; c < (int)sVar6; c = c + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_90,(long)c);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_90,(long)nvert);
      if (y < dVar1 != y < *pvVar5) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &verty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)nvert);
        dVar1 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &verty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)c);
        dVar7 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_90,(long)c);
        dVar8 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_90,(long)nvert);
        dVar2 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_90,(long)c);
        dVar3 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &verty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)c);
        if (x < ((dVar1 - dVar7) * (y - dVar8)) / (dVar2 - dVar3) + *pvVar5) {
          bVar4 = (bool)(bVar4 ^ 1);
        }
      }
      nvert = c;
    }
    if (bVar4) {
      if (1.0 <= _j) {
        local_1a0 = _j;
      }
      else {
        local_1a0 = 1.0;
      }
      _j = local_1a0;
    }
    else {
      if (-1.0 <= _j) {
        local_1a8 = _j;
      }
      else {
        local_1a8 = -1.0;
      }
      _j = local_1a8;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_90);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &verty.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return _j;
}

Assistant:

inline double CheckInsideObstacle(double x, double y, bool measureDist)
{
	double result = -1;

#ifndef DISABLE_OPENCV_SUPPORT
	int i = 0;
	double d = 0;
	vector<cv::Point2f> contours;

	// Environment circles.
	for (i = 0; i < (int)circles_r.size(); i++)
	{
		d = circles_r[i]-sqrt(sqr(circles_x[i]-x)+sqr(circles_y[i]-y));
		if ((!measureDist)&&(d != 0)) d = sign(d, 0);
		result = max(d, result);
	}

	// Environment walls.
	for (i = 0; i < (int)walls_xa.size(); i++)
	{
		contours.push_back(cv::Point2f((float)walls_xa[i], (float)walls_ya[i]));
		contours.push_back(cv::Point2f((float)walls_xb[i], (float)walls_yb[i]));
	}
	if (contours.size() > 0) result = max(cv::pointPolygonTest(contours, cv::Point2f((float)x, (float)y), measureDist), result);
#else
	int i = 0, j = 0, c = 0, nvert = 0;
	double d = 0, Xmin = MAX_UNCERTAINTY, Xmax = -MAX_UNCERTAINTY, Ymin = MAX_UNCERTAINTY, Ymax = -MAX_UNCERTAINTY;
	std::vector<double> vertx, verty;

	// Environment circles.
	for (i = 0; i < (int)circles_r.size(); i++)
	{
		d = circles_r[i]-sqrt(sqr(circles_x[i]-x)+sqr(circles_y[i]-y));
		if ((!measureDist)&&(d != 0)) d = sign(d, 0);
		result = max(d, result);
	}

	// Environment walls.
	for (i = 0; i < (int)walls_xa.size(); i++)
	{
		Xmin = min(Xmin, walls_xa[i]); Xmin = min(Xmin, walls_xb[i]);
		Xmax = max(Xmax, walls_xa[i]); Xmax = max(Xmax, walls_xb[i]);
		Ymin = min(Ymin, walls_ya[i]); Ymin = min(Ymin, walls_yb[i]);
		Ymax = max(Ymax, walls_ya[i]); Ymax = max(Ymax, walls_yb[i]);
		vertx.push_back(walls_xa[i]);
		vertx.push_back(walls_xb[i]);
		verty.push_back(walls_ya[i]);
		verty.push_back(walls_yb[i]);
	}
	// First check bounding rectangle.
	if ((x < Xmin)||(x > Xmax)||(y < Ymin)||(y > Ymax))
	{
		// Approximation...
		result = max(-1.0, result);
	}
	else
	{
		// Approximation...
		// https://stackoverflow.com/questions/217578/how-can-i-determine-whether-a-2d-point-is-within-a-polygon
		nvert = (int)vertx.size();
		for (i = 0, j = nvert-1; i < nvert; j = i++)
		{
			if (((verty[i] > y) != (verty[j]> y)) &&
				(x < (vertx[j]-vertx[i]) * (y-verty[i]) / (verty[j]-verty[i]) + vertx[i]))
				c = !c;
		}
		if (c) result = max(1.0, result); else result = max(-1.0, result);
	}
#endif // !DISABLE_OPENCV_SUPPORT

	return result;
}